

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

void ZXing::GetPatternRow<unsigned_char_const*>
               (Range<const_unsigned_char_*> b_row,PatternRow *p_row)

{
  int iVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  uchar *puVar5;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_RDX;
  int step;
  unsigned_long z;
  unsigned_long asSimd1;
  unsigned_long asSimd0;
  unsigned_short *intPos;
  uchar *bitPosEnd;
  uchar *bitPos;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffa0;
  unsigned_short *local_48;
  uchar *local_38;
  Range<const_unsigned_char_*> local_10;
  
  Range<const_unsigned_char_*>::size((Range<const_unsigned_char_*> *)in_RDX._M_current);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(in_stack_ffffffffffffff78);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(in_stack_ffffffffffffff78);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,int>
            (in_RDX,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_38 = Range<const_unsigned_char_*>::begin(&local_10);
  puVar2 = Range<const_unsigned_char_*>::end(&local_10);
  local_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x21c5ef);
  if (*local_38 != '\0') {
    local_48 = local_48 + 1;
  }
  while (local_38 < puVar2 + -8) {
    uVar3 = BitHacks::LoadU<unsigned_long>(local_38);
    uVar4 = BitHacks::LoadU<unsigned_long>(local_38 + 1);
    in_stack_ffffffffffffffa0 =
         (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(uVar3 ^ uVar4);
    if (in_stack_ffffffffffffffa0 == (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0)
    {
      *local_48 = *local_48 + 8;
      local_38 = local_38 + 8;
    }
    else {
      iVar1 = BitHacks::NumberOfTrailingZeros<unsigned_long,void>
                        ((unsigned_long)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff9c = iVar1 / 8 + 1;
      *local_48 = *local_48 + (short)in_stack_ffffffffffffff9c;
      local_38 = local_38 + in_stack_ffffffffffffff9c;
      local_48 = local_48 + 1;
    }
  }
  while (puVar5 = local_38 + 1, puVar5 != puVar2) {
    *local_48 = *local_48 + 1;
    local_48 = local_48 + (int)(uint)(*puVar5 != *local_38);
    local_38 = puVar5;
  }
  *local_48 = *local_48 + 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x21c768);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  return;
}

Assistant:

void GetPatternRow(Range<I> b_row, PatternRow& p_row)
{
	// TODO: if reactivating the bit-packed array (!ZX_FAST_BIT_STORAGE) should be of interest then the following code could be
	// considerably speed up by using a specialized variant along the lines of the old BitArray::getNextSetTo() function that
	// was removed between 1.4 and 2.0.

#if 0
	p_row.reserve(64);
	p_row.clear();

	auto lastPos = b_row.begin();
	if (*lastPos)
		p_row.push_back(0); // first value is number of white pixels, here 0

	for (auto p = b_row.begin() + 1; p < b_row.end(); ++p)
		if (bool(*p) != bool(*lastPos))
			p_row.push_back(p - std::exchange(lastPos, p));

	p_row.push_back(b_row.end() - lastPos);

	if (*lastPos)
		p_row.push_back(0); // last value is number of white pixels, here 0
#else
	p_row.resize(b_row.size() + 2);
	std::fill(p_row.begin(), p_row.end(), 0);

	auto bitPos = b_row.begin();
	const auto bitPosEnd = b_row.end();
	auto intPos = p_row.data();

	if (*bitPos)
		intPos++; // first value is number of white pixels, here 0

	// The following code as been observed to cause a speedup of up to 30% on large images on an AVX cpu
	// and on an a Google Pixel 3 Android phone. Your mileage may vary.
	if constexpr (std::is_pointer_v<I> && sizeof(I) == 8 && sizeof(std::remove_pointer_t<I>) == 1) {
		using simd_t = uint64_t;
		while (bitPos < bitPosEnd - sizeof(simd_t)) {
			auto asSimd0 = BitHacks::LoadU<simd_t>(bitPos);
			auto asSimd1 = BitHacks::LoadU<simd_t>(bitPos + 1);
			auto z = asSimd0 ^ asSimd1;
			if (z) {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
				int step = BitHacks::NumberOfTrailingZeros(z) / 8 + 1;
#else
				int step = BitHacks::NumberOfLeadingZeros(z) / 8 + 1;
#endif
				(*intPos++) += step;
				bitPos += step;
			} else {
				(*intPos) += sizeof(simd_t);
				bitPos += sizeof(simd_t);
			}
		}
	}

	while (++bitPos != bitPosEnd) {
		++(*intPos);
		intPos += bitPos[0] != bitPos[-1];
	}
	++(*intPos);

	if (bitPos[-1])
		intPos++;

	p_row.resize(intPos - p_row.data() + 1);
#endif
}